

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::findStartxref(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  InputSource *this_00;
  int iVar2;
  qpdf_offset_t qVar3;
  bool bVar4;
  long *local_110;
  size_t local_108;
  long local_100 [2];
  Token local_f0;
  Token local_88;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  ::qpdf::Tokenizer::readToken
            (&local_f0,&(_Var1._M_head_impl)->tokenizer,
             ((_Var1._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(_Var1._M_head_impl)->last_object_description,true,0);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"startxref","");
  if ((local_f0.type == tt_word) && (local_f0.value._M_string_length == local_108)) {
    if (local_f0.value._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_f0.value._M_dataplus._M_p,local_110,local_f0.value._M_string_length);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              (&local_88,&(_Var1._M_head_impl)->tokenizer,
               ((_Var1._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var1._M_head_impl)->last_object_description,true,0);
    bVar4 = local_88.type == tt_integer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.error_message._M_dataplus._M_p != &local_88.error_message.field_2) {
      operator_delete(local_88.error_message._M_dataplus._M_p,
                      local_88.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.raw_value._M_dataplus._M_p != &local_88.raw_value.field_2) {
      operator_delete(local_88.raw_value._M_dataplus._M_p,
                      local_88.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.value._M_dataplus._M_p != &local_88.value.field_2) {
      operator_delete(local_88.value._M_dataplus._M_p,
                      local_88.value.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = false;
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.error_message._M_dataplus._M_p != &local_f0.error_message.field_2) {
    operator_delete(local_f0.error_message._M_dataplus._M_p,
                    local_f0.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.raw_value._M_dataplus._M_p != &local_f0.raw_value.field_2) {
    operator_delete(local_f0.raw_value._M_dataplus._M_p,
                    local_f0.raw_value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.value._M_dataplus._M_p != &local_f0.value.field_2) {
    operator_delete(local_f0.value._M_dataplus._M_p,local_f0.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar4 != false) {
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar3 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar3,0);
  }
  return bVar4;
}

Assistant:

bool
QPDF::findStartxref()
{
    if (readToken(*m->file).isWord("startxref") && readToken(*m->file).isInteger()) {
        // Position in front of offset token
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}